

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2region_coverer.cc
# Opt level: O0

void __thiscall
S2RegionCoverer::AdjustCellLevels
          (S2RegionCoverer *this,vector<S2CellId,_std::allocator<S2CellId>_> *cells)

{
  vector<S2CellId,_std::allocator<S2CellId>_> *this_00;
  bool bVar1;
  int iVar2;
  int level_00;
  ostream *poVar3;
  reference pSVar4;
  reference pvVar5;
  bool local_b9;
  int new_level;
  int level;
  S2CellId id;
  iterator __end1;
  iterator __begin1;
  vector<S2CellId,_std::allocator<S2CellId>_> *__range1;
  int out;
  S2LogMessage local_40;
  S2LogMessageVoidify local_29;
  S2CellId *local_28;
  __normal_iterator<S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_> local_20;
  vector<S2CellId,_std::allocator<S2CellId>_> *local_18;
  vector<S2CellId,_std::allocator<S2CellId>_> *cells_local;
  S2RegionCoverer *this_local;
  
  local_18 = cells;
  cells_local = (vector<S2CellId,_std::allocator<S2CellId>_> *)this;
  local_20._M_current = (S2CellId *)std::vector<S2CellId,_std::allocator<S2CellId>_>::begin(cells);
  local_28 = (S2CellId *)std::vector<S2CellId,_std::allocator<S2CellId>_>::end(local_18);
  bVar1 = std::
          is_sorted<__gnu_cxx::__normal_iterator<S2CellId*,std::vector<S2CellId,std::allocator<S2CellId>>>>
                    (local_20,(__normal_iterator<S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>
                               )local_28);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2region_coverer.cc"
               ,0xc5,kFatal,(ostream *)&std::cerr);
    poVar3 = S2LogMessage::stream(&local_40);
    poVar3 = std::operator<<(poVar3,"Check failed: is_sorted(cells->begin(), cells->end()) ");
    S2LogMessageVoidify::operator&(&local_29,poVar3);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_40);
  }
  iVar2 = Options::level_mod(&this->options_);
  this_00 = local_18;
  if (iVar2 != 1) {
    __range1._0_4_ = 0;
    __end1 = std::vector<S2CellId,_std::allocator<S2CellId>_>::begin(local_18);
    id.id_ = (uint64)std::vector<S2CellId,_std::allocator<S2CellId>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>
                                       *)&id), bVar1) {
      pSVar4 = __gnu_cxx::
               __normal_iterator<S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>::
               operator*(&__end1);
      _new_level = pSVar4->id_;
      iVar2 = S2CellId::level((S2CellId *)&new_level);
      level_00 = AdjustLevel(this,iVar2);
      if (level_00 != iVar2) {
        _new_level = S2CellId::parent((S2CellId *)&new_level,level_00);
      }
      if ((int)__range1 < 1) {
LAB_004e8dd4:
        while( true ) {
          local_b9 = false;
          if (0 < (int)__range1) {
            pvVar5 = std::vector<S2CellId,_std::allocator<S2CellId>_>::operator[]
                               (local_18,(long)((int)__range1 + -1));
            local_b9 = S2CellId::contains((S2CellId *)&new_level,(S2CellId)pvVar5->id_);
          }
          if (local_b9 == false) break;
          __range1._0_4_ = (int)__range1 + -1;
        }
        pvVar5 = std::vector<S2CellId,_std::allocator<S2CellId>_>::operator[]
                           (local_18,(long)(int)__range1);
        pvVar5->id_ = _new_level;
        __range1._0_4_ = (int)__range1 + 1;
      }
      else {
        pvVar5 = std::vector<S2CellId,_std::allocator<S2CellId>_>::operator[]
                           (local_18,(long)((int)__range1 + -1));
        bVar1 = S2CellId::contains(pvVar5,_new_level);
        if (!bVar1) goto LAB_004e8dd4;
      }
      __gnu_cxx::__normal_iterator<S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>::
      operator++(&__end1);
    }
    std::vector<S2CellId,_std::allocator<S2CellId>_>::resize(local_18,(long)(int)__range1);
  }
  return;
}

Assistant:

void S2RegionCoverer::AdjustCellLevels(vector<S2CellId>* cells) const {
  S2_DCHECK(is_sorted(cells->begin(), cells->end()));
  if (options_.level_mod() == 1) return;

  int out = 0;
  for (S2CellId id : *cells) {
    int level = id.level();
    int new_level = AdjustLevel(level);
    if (new_level != level) id = id.parent(new_level);
    if (out > 0 && (*cells)[out-1].contains(id)) continue;
    while (out > 0 && id.contains((*cells)[out-1])) --out;
    (*cells)[out++] = id;
  }
  cells->resize(out);
}